

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_aligned.cc
# Opt level: O1

void runOnce<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>>
               (void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  Sequence *pSVar4;
  ulong uVar5;
  atomic<long> *paVar6;
  ostream *poVar7;
  ulong uVar8;
  Sequence *pSVar9;
  long *plVar10;
  long lVar11;
  undefined4 uVar12;
  undefined4 uVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> seqs;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  s;
  string local_2c0;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> local_2a0;
  reference_wrapper<disruptor::Sequence> local_280;
  undefined1 local_278 [32];
  long *local_258;
  undefined8 local_250;
  long *local_248;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  local_240;
  undefined1 auVar13 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Staring run ",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  LOCK();
  sum.super___atomic_base<long>._M_i = (__atomic_base<long>)0;
  UNLOCK();
  uVar8 = (ulong)nc;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar8;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x78),8) == 0) {
    uVar5 = SUB168(auVar1 * ZEXT816(0x78),0);
  }
  pSVar4 = (Sequence *)operator_new__(uVar5);
  auVar2 = _DAT_00129040;
  auVar1 = _DAT_00129030;
  if (uVar8 != 0) {
    uVar5 = uVar8 * 0x78 - 0x78;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar5;
    uVar12 = SUB164(auVar17 * ZEXT816(0x8888888888888889),8);
    uVar15 = (undefined4)(uVar5 / 0x1e0000000);
    auVar13._0_8_ = CONCAT44(uVar15,uVar12);
    auVar13._8_4_ = uVar12;
    auVar13._12_4_ = uVar15;
    auVar14._0_8_ = auVar13._0_8_ >> 6;
    auVar14._8_8_ = auVar13._8_8_ >> 6;
    paVar6 = &pSVar4[1].sequence_;
    uVar8 = 0;
    auVar14 = auVar14 ^ _DAT_00129040;
    do {
      auVar16._8_4_ = (int)uVar8;
      auVar16._0_8_ = uVar8;
      auVar16._12_4_ = (int)(uVar8 >> 0x20);
      auVar17 = (auVar16 | auVar1) ^ auVar2;
      if ((bool)(~(auVar17._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar17._0_4_ ||
                  auVar14._4_4_ < auVar17._4_4_) & 1)) {
        paVar6[-0xf] = (__atomic_base<long>)0xffffffffffffffff;
      }
      if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
          auVar17._12_4_ <= auVar14._12_4_) {
        (paVar6->super___atomic_base<long>)._M_i = -1;
      }
      uVar8 = uVar8 + 2;
      paVar6 = paVar6 + 0x1e;
    } while ((uVar5 / 0x78 + 2 & 0xfffffffffffffffe) != uVar8);
  }
  local_2a0.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a0.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a0.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Sequence **)0x0;
  disruptor::
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  ::Sequencer(&local_240,RING_BUFFER_SIZE);
  if (0 < nc) {
    lVar11 = 0;
    pSVar9 = pSVar4;
    do {
      local_2c0._M_dataplus._M_p = (pointer)pSVar9;
      if (local_2a0.
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2a0.
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<disruptor::Sequence*,std::allocator<disruptor::Sequence*>>::
        _M_realloc_insert<disruptor::Sequence*>
                  ((vector<disruptor::Sequence*,std::allocator<disruptor::Sequence*>> *)&local_2a0,
                   (iterator)
                   local_2a0.
                   super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(Sequence **)&local_2c0);
      }
      else {
        *local_2a0.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = pSVar9;
        local_2a0.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_2a0.
             super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      lVar11 = lVar11 + 1;
      pSVar9 = pSVar9 + 1;
    } while (lVar11 < nc);
  }
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::operator=
            (&local_240.gating_sequences_,&local_2a0);
  iVar3 = nc;
  lVar11 = (long)nc;
  uVar5 = lVar11 * 8;
  uVar8 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar8 = 0xffffffffffffffff;
  }
  if (lVar11 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  local_248 = (long *)operator_new__(uVar8);
  *local_248 = lVar11;
  plVar10 = local_248 + 1;
  if (iVar3 != 0) {
    memset(plVar10,0,uVar5);
  }
  if (0 < nc) {
    lVar11 = 0;
    pSVar9 = pSVar4;
    do {
      local_278._0_8_ = &local_240;
      local_280._M_data = pSVar9;
      std::thread::
      thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,64>&,disruptor::Sequence&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,64>>,std::reference_wrapper<disruptor::Sequence>,void>
                ((thread *)&local_2c0,
                 consume<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>>
                 ,(reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>_>
                   *)local_278,&local_280);
      if (plVar10[lVar11] != 0) goto LAB_0011d622;
      plVar10[lVar11] = (long)local_2c0._M_dataplus._M_p;
      lVar11 = lVar11 + 1;
      pSVar9 = pSVar9 + 1;
    } while (lVar11 < nc);
  }
  iVar3 = np;
  lVar11 = (long)np;
  uVar5 = lVar11 * 8;
  uVar8 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar8 = 0xffffffffffffffff;
  }
  if (lVar11 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  local_258 = (long *)operator_new__(uVar8);
  *local_258 = lVar11;
  plVar10 = local_258 + 1;
  if (iVar3 != 0) {
    memset(plVar10,0,uVar5);
  }
  local_250 = std::chrono::_V2::system_clock::now();
  if (0 < np) {
    lVar11 = 0;
    do {
      local_278._0_8_ = &local_240;
      std::thread::
      thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,64>&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,64>>,void>
                ((thread *)&local_2c0,
                 produce<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>>
                 ,(reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>_>
                   *)local_278);
      if (plVar10[lVar11] != 0) goto LAB_0011d622;
      plVar10[lVar11] = (long)local_2c0._M_dataplus._M_p;
      lVar11 = lVar11 + 1;
    } while (lVar11 < np);
  }
  plVar10 = local_248;
  if (0 < np) {
    lVar11 = 0;
    do {
      std::thread::join();
      lVar11 = lVar11 + 1;
    } while (lVar11 < np);
  }
  if (0 < nc) {
    lVar11 = 0;
    do {
      std::thread::join();
      lVar11 = lVar11 + 1;
    } while (lVar11 < nc);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nBatch size: ",0xd);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," Ring buffer size: ",0x13);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," Alignment: ",0xc);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x40);
  local_2c0._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_2c0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cursor: ",8);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  local_2c0._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_2c0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sum: ",5);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," Expected sum: ",0xf);
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  local_2c0._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_2c0,1);
  std::chrono::_V2::system_clock::now();
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,np);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"P-",2);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,nc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"C ",2);
  demangle_abi_cxx11_(&local_2c0,"N9disruptor23MultiThreadedStrategyExE");
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  demangle_abi_cxx11_((string *)local_278,
                      "N9disruptor16SleepingStrategyILl200ENSt6chrono8durationIlSt5ratioILl1ELl1000EEEELi1EEE"
                     );
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)local_278._0_8_,local_278._8_8_);
  local_280._M_data._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_280,1);
  if ((Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
       *)local_278._0_8_ !=
      (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
       *)(local_278 + 0x10)) {
    operator_delete((void *)local_278._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ops/secs",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Milliseconds: ",0xe);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n\n",2);
  if (*plVar10 != 0) {
    lVar11 = *plVar10 << 3;
    do {
      if (*(long *)((long)plVar10 + lVar11) != 0) goto LAB_0011d622;
      lVar11 = lVar11 + -8;
    } while (lVar11 != 0);
  }
  operator_delete__(plVar10);
  if (*local_258 != 0) {
    lVar11 = *local_258 << 3;
    do {
      if (*(long *)((long)local_258 + lVar11) != 0) {
LAB_0011d622:
        std::terminate();
      }
      lVar11 = lVar11 + -8;
    } while (lVar11 != 0);
  }
  operator_delete__(local_258);
  operator_delete__(pSVar4);
  if (local_240.gating_sequences_.
      super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.gating_sequences_.
                    super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_240.claim_strategy_.available_buffer_.
      super__Vector_base<std::atomic<int>,_std::allocator<std::atomic<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.claim_strategy_.available_buffer_.
                    super__Vector_base<std::atomic<int>,_std::allocator<std::atomic<int>_>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_240.ring_buffer_.events_.
      super__Vector_base<disruptor::RingBuffer<long,_64>::AlignedElement,_std::allocator<disruptor::RingBuffer<long,_64>::AlignedElement>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.ring_buffer_.events_.
                    super__Vector_base<disruptor::RingBuffer<long,_64>::AlignedElement,_std::allocator<disruptor::RingBuffer<long,_64>::AlignedElement>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a0.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.
                    super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void runOnce() {
  std::cout << "Staring run " << std::endl;

  sum.store(0);

  disruptor::Sequence* sequences = new disruptor::Sequence[nc];

  std::vector<disruptor::Sequence*> seqs;
  disruptor::Sequencer<T, C, W, Alignment> s(RING_BUFFER_SIZE);

  for (int i = 0; i < nc; ++i) seqs.push_back(&sequences[i]);

  s.set_gating_sequences(seqs);

  std::thread* tc = new std::thread[nc];
  for (int i = 0; i < nc; ++i)
    tc[i] = std::thread(consume<T, C, W>, std::ref(s), std::ref(sequences[i]));

  std::thread* tp = new std::thread[np];

  auto start_time = std::chrono::high_resolution_clock::now();

  for (int i = 0; i < np; ++i)
    tp[i] = std::thread(produce<T, C, W>, std::ref(s));

  // std::this_thread::sleep_for(std::chrono::seconds(3));

  for (int i = 0; i < np; ++i) tp[i].join();
  for (int i = 0; i < nc; ++i) tc[i].join();

  int64_t cursor = s.GetCursor();
  std::cout << "\nBatch size: " << delta
            << " Ring buffer size: " << RING_BUFFER_SIZE
            << " Alignment: " << Alignment << '\n';
  std::cout << "Cursor: " << cursor << '\n';
  std::cout << "Sum: " << sum.load() << " Expected sum: "
            << (expectedValue * (expectedValue + 1) * nc) / 2 << '\n';

  auto end_time = std::chrono::high_resolution_clock::now();
  auto diff = end_time - start_time;

  // std::cout.precision(15);
  std::cout << np << "P-" << nc << "C " << demangle(typeid(C).name()) << " "
            << demangle(typeid(W).name()) << '\n';
  std::cout << (cursor * 1000) /
                   (std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                        .count())
            << " ops/secs"
            << "\n";

  std::cout << "Milliseconds: " << std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                          .count() << "\n\n";

  delete[] tc;
  delete[] tp;
  delete[] sequences;
}